

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarClau(Abc_Ntk_t *pNtk,int nFrames,int nPref,int nClauses,int nLutSize,int nLevels,
                  int nCutsMax,int nBatches,int fStepUp,int fBmc,int fRefs,int fTarget,int fVerbose,
                  int fVeryVerbose)

{
  Vec_Int_t *__ptr;
  Aig_Man_t *pAig;
  
  if ((fTarget == 0) || (pNtk->vPos->nSize == 1)) {
    pAig = Abc_NtkToDar(pNtk,0,1);
    if (pAig != (Aig_Man_t *)0x0) {
      __ptr = pAig->vFlopNums;
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      pAig->vFlopNums = (Vec_Int_t *)0x0;
      Fra_Claus(pAig,nFrames,nPref,nClauses,nLutSize,nLevels,nCutsMax,nBatches,fStepUp,fBmc,fRefs,
                fTarget,fVerbose,fVeryVerbose);
      Aig_ManStop(pAig);
    }
  }
  else {
    Abc_Print((int)pNtk,"The number of outputs should be 1.\n");
  }
  return 1;
}

Assistant:

int Abc_NtkDarClau( Abc_Ntk_t * pNtk, int nFrames, int nPref, int nClauses, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRefs, int fTarget, int fVerbose, int fVeryVerbose )
{
    extern int Fra_Clau( Aig_Man_t * pMan, int nIters, int fVerbose, int fVeryVerbose );
    extern int Fra_Claus( Aig_Man_t * pAig, int nFrames, int nPref, int nClauses, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRefs, int fTarget, int fVerbose, int fVeryVerbose );
    Aig_Man_t * pMan;
    if ( fTarget && Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( 1, "The number of outputs should be 1.\n" );
        return 1;
    }
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return 1;
//    Aig_ManReduceLachesCount( pMan );
    if ( pMan->vFlopNums )
        Vec_IntFree( pMan->vFlopNums ); 
    pMan->vFlopNums = NULL;

//    Fra_Clau( pMan, nStepsMax, fVerbose, fVeryVerbose );
    Fra_Claus( pMan, nFrames, nPref, nClauses, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fBmc, fRefs, fTarget, fVerbose, fVeryVerbose );
    Aig_ManStop( pMan );
    return 1;
}